

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

void move_pos(lzma_mf *mf)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t uVar7;
  
  uVar5 = mf->cyclic_pos + 1;
  uVar4 = 0;
  if (uVar5 != mf->cyclic_size) {
    uVar4 = uVar5;
  }
  mf->cyclic_pos = uVar4;
  uVar4 = mf->read_pos + 1;
  mf->read_pos = uVar4;
  if (uVar4 <= mf->write_pos) {
    if (uVar4 + mf->offset == -1) {
      uVar1 = mf->sons_count;
      uVar2 = mf->hash_size_sum;
      uVar4 = ~mf->cyclic_size;
      puVar3 = mf->hash;
      for (uVar6 = 0; uVar1 + uVar2 != uVar6; uVar6 = uVar6 + 1) {
        uVar5 = puVar3[uVar6];
        uVar7 = uVar5 - uVar4;
        if (uVar5 < uVar4) {
          uVar7 = 0;
        }
        puVar3[uVar6] = uVar7;
      }
      mf->offset = mf->offset - uVar4;
    }
    return;
  }
  __assert_fail("mf->read_pos <= mf->write_pos",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                ,0xa2,"void move_pos(lzma_mf *)");
}

Assistant:

static void
move_pos(lzma_mf *mf)
{
	if (++mf->cyclic_pos == mf->cyclic_size)
		mf->cyclic_pos = 0;

	++mf->read_pos;
	assert(mf->read_pos <= mf->write_pos);

	if (unlikely(mf->read_pos + mf->offset == UINT32_MAX))
		normalize(mf);
}